

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O2

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  uv_loop_t *loop;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  client_t *handle;
  bool bVar5;
  undefined8 uVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,&server_handle,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_listen((uv_stream_t *)&server_handle,0x80,connection_cb);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        lVar4 = 10;
        handle = clients;
        while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
          iVar1 = uv_pipe_init(loop,&handle->pipe_handle,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a != 0) {
            pcVar3 = "0";
            pcVar2 = "r";
            uVar6 = 0x5d;
            goto LAB_0015d07a;
          }
          uv_pipe_connect(&handle->conn_req,&handle->pipe_handle,"/tmp/uv-test-sock",connect_cb);
          handle = handle + 1;
        }
        uv_run(loop,UV_RUN_DEFAULT);
        eval_a = (int64_t)connection_cb_called;
        eval_b = 10;
        if (eval_a == 10) {
          eval_a = (int64_t)connect_cb_called;
          eval_b = 10;
          if (eval_a == 10) {
            close_loop(loop);
            eval_a = 0;
            iVar1 = uv_loop_close(loop);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar3 = "uv_loop_close(loop)";
            pcVar2 = "0";
            uVar6 = 0x69;
          }
          else {
            pcVar3 = "10";
            pcVar2 = "connect_cb_called";
            uVar6 = 0x67;
          }
        }
        else {
          pcVar3 = "10";
          pcVar2 = "connection_cb_called";
          uVar6 = 0x66;
        }
      }
      else {
        pcVar3 = "0";
        pcVar2 = "r";
        uVar6 = 0x59;
      }
    }
    else {
      pcVar3 = "0";
      pcVar2 = "r";
      uVar6 = 0x56;
    }
  }
  else {
    pcVar3 = "0";
    pcVar2 = "r";
    uVar6 = 0x53;
  }
LAB_0015d07a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
          ,uVar6,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}